

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall printing_callbacks::on_string(printing_callbacks *this,string *value)

{
  ostream *poVar1;
  string *value_local;
  printing_callbacks *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"string: ");
  poVar1 = std::operator<<(poVar1,(string *)value);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void on_string(const std::string& value)
    {
        std::cout << "string: " << value << std::endl;
    }